

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O3

void e_died(entity *etmp,int dest,int how)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  long lVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar13 [16];
  coord xy;
  coord local_a;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (etmp->emon == &youmonst) {
    if (how == 5) {
      killer = (char *)0x0;
      lava_effects();
    }
    else if (how == 4) {
      killer = (char *)0x0;
      drown();
    }
    else {
      if (killer == (char *)0x0) {
        killer_format = 0;
        killer = "falling drawbridge";
      }
      done(how);
      bVar3 = e_survives_at(etmp,etmp->ex,etmp->ey);
      if ((bVar3 == '\0') &&
         (bVar3 = enexto(&local_a,level,(xchar)etmp->ex,(xchar)etmp->ey,etmp->edata), bVar3 != '\0')
         ) {
        pcVar5 = "strange";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar5 = "normal";
          }
          else {
            bVar3 = dmgtype(youmonst.data,0x24);
            pcVar5 = "strange";
            if (bVar3 == '\0') {
              pcVar5 = "normal";
            }
          }
        }
        pline("A %s force teleports you away...",pcVar5);
        teleds((int)local_a.x,(int)local_a.y,'\0');
      }
    }
    auVar12._8_6_ = 0;
    auVar12[0] = u.ux;
    auVar12[1] = u.uy;
    auVar12[2] = u.dx;
    auVar12[3] = u.dy;
    auVar12[4] = u.tx;
    auVar12[5] = u.ty;
    auVar12[6] = u.ux0;
    auVar12[7] = u.uy0;
    auVar12[0xe] = u.uy0;
    auVar12[0xf] = u.uy0;
    auVar11._14_2_ = auVar12._14_2_;
    auVar11._8_5_ = 0;
    auVar11[0] = u.ux;
    auVar11[1] = u.uy;
    auVar11[2] = u.dx;
    auVar11[3] = u.dy;
    auVar11[4] = u.tx;
    auVar11[5] = u.ty;
    auVar11[6] = u.ux0;
    auVar11[7] = u.uy0;
    auVar11[0xd] = u.ux0;
    auVar10._13_3_ = auVar11._13_3_;
    auVar10._8_4_ = 0;
    auVar10[0] = u.ux;
    auVar10[1] = u.uy;
    auVar10[2] = u.dx;
    auVar10[3] = u.dy;
    auVar10[4] = u.tx;
    auVar10[5] = u.ty;
    auVar10[6] = u.ux0;
    auVar10[7] = u.uy0;
    auVar10[0xc] = u.ux0;
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._8_3_ = 0;
    auVar9[0] = u.ux;
    auVar9[1] = u.uy;
    auVar9[2] = u.dx;
    auVar9[3] = u.dy;
    auVar9[4] = u.tx;
    auVar9[5] = u.ty;
    auVar9[6] = u.ux0;
    auVar9[7] = u.uy0;
    auVar9[0xb] = u.ty;
    auVar8._11_5_ = auVar9._11_5_;
    auVar8._8_2_ = 0;
    auVar8[0] = u.ux;
    auVar8[1] = u.uy;
    auVar8[2] = u.dx;
    auVar8[3] = u.dy;
    auVar8[4] = u.tx;
    auVar8[5] = u.ty;
    auVar8[6] = u.ux0;
    auVar8[7] = u.uy0;
    auVar8[10] = u.ty;
    auVar7._10_6_ = auVar8._10_6_;
    auVar7[8] = 0;
    auVar7[0] = u.ux;
    auVar7[1] = u.uy;
    auVar7[2] = u.dx;
    auVar7[3] = u.dy;
    auVar7[4] = u.tx;
    auVar7[5] = u.ty;
    auVar7[6] = u.ux0;
    auVar7[7] = u.uy0;
    auVar7[9] = u.tx;
    auVar6._9_7_ = auVar7._9_7_;
    auVar6[8] = u.tx;
    auVar6[0] = u.ux;
    auVar6[1] = u.uy;
    auVar6[2] = u.dx;
    auVar6[3] = u.dy;
    auVar6[4] = u.tx;
    auVar6[5] = u.ty;
    auVar6[6] = u.ux0;
    auVar6[7] = u.uy0;
    auVar13._8_8_ = auVar6._8_8_;
    auVar13[7] = u.dy;
    auVar13[6] = u.dy;
    auVar13[5] = u.dx;
    auVar13[4] = u.dx;
    auVar13[3] = u.uy;
    auVar13[2] = u.uy;
    auVar13[0] = u.ux;
    auVar13[1] = auVar13[0];
    auVar13 = pshuflw(auVar13,auVar13,0x60);
    etmp->ex = auVar13._0_4_ >> 0x18;
    etmp->ey = auVar13._4_4_ >> 0x18;
  }
  else {
    killer = (char *)0x0;
    if (flags.mon_moving == '\0') {
      xkilled(etmp->emon,dest);
    }
    else {
      pcVar5 = (char *)0x0;
      if ((dest & 1U) != 0) {
        pcVar5 = "";
      }
      monkilled(etmp->emon,pcVar5,(dest << 0x1e) >> 0x1f & 0x1a);
    }
    etmp->edata = (permonst *)0x0;
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      if ((occupants + lVar4 != etmp) && (etmp->emon == occupants[lVar4].emon)) {
        occupants[lVar4].edata = (permonst *)0x0;
      }
      lVar4 = 1;
      bVar1 = false;
    } while (bVar2);
  }
  return;
}

Assistant:

static void e_died(struct entity *etmp, int dest, int how)
{
	if (is_u(etmp)) {
		if (how == DROWNING) {
			killer = 0;	/* drown() sets its own killer */
			drown();
		} else if (how == BURNING) {
			killer = 0;	/* lava_effects() sets its own killer */
			lava_effects();
		} else {
			coord xy;

			/* use more specific killer if specified */
			if (!killer) {
			    killer_format = KILLED_BY_AN;
			    killer = "falling drawbridge";
			}
			done(how);
			/* So, you didn't die */
			if (!e_survives_at(etmp, etmp->ex, etmp->ey)) {
			    if (enexto(&xy, level, etmp->ex, etmp->ey, etmp->edata)) {
				pline("A %s force teleports you away...",
				      Hallucination ? "normal" : "strange");
				teleds(xy.x, xy.y, FALSE);
			    }
			    /* otherwise on top of the drawbridge is the
			     * only viable spot in the dungeon, so stay there
			     */
			}
		}
		/* we might have crawled out of the moat to survive */
		etmp->ex = u.ux,  etmp->ey = u.uy;
	} else {
		int entitycnt;

		killer = 0;
		/* fake "digested to death" damage-type suppresses corpse */
#define mk_message(dest) ((dest & 1) ? "" : NULL)
#define mk_corpse(dest)  ((dest & 2) ? AD_DGST : AD_PHYS)
		/* if monsters are moving, one of them caused the destruction */
		if (flags.mon_moving)
		    monkilled(etmp->emon, mk_message(dest), mk_corpse(dest));
		else		/* you caused it */
		    xkilled(etmp->emon, dest);
		etmp->edata = NULL;

		/* dead long worm handling */
		for (entitycnt = 0; entitycnt < ENTITIES; entitycnt++) {
		    if (etmp != &(occupants[entitycnt]) &&
			etmp->emon == occupants[entitycnt].emon)
			occupants[entitycnt].edata = NULL;
		}
#undef mk_message
#undef mk_corpse
	}
}